

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,Script *script,AddressFormatData *network_parameter)

{
  uint8_t prefix;
  AddressFormatData *in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  uint8_t local_5d;
  AddressType local_5c;
  CfdSourceLocation local_58;
  allocator local_29;
  AddressFormatData *local_28;
  AddressFormatData *network_parameter_local;
  Script *script_local;
  Address *pAStack_10;
  NetType_conflict type_local;
  Address *this_local;
  
  this->type_ = type;
  this->addr_type_ = kP2shAddress;
  this->witness_ver_ = kVersionNone;
  local_28 = network_parameter;
  network_parameter_local = (AddressFormatData *)script;
  script_local._4_4_ = type;
  pAStack_10 = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&this->address_,"",&local_29);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_29);
  ByteData::ByteData(&this->hash_);
  Pubkey::Pubkey(&this->pubkey_);
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  Script::Script(&this->redeem_script_,(Script *)network_parameter_local);
  AddressFormatData::AddressFormatData
            ((AddressFormatData *)
             CONCAT17(in_stack_ffffffffffffff57,
                      CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
             in_stack_ffffffffffffff48);
  this->checksum_[0] = '\0';
  this->checksum_[1] = '\0';
  this->checksum_[2] = '\0';
  this->checksum_[3] = '\0';
  SetNetType(this,&this->format_data_);
  prefix = AddressFormatData::GetP2shPrefix(local_28);
  CalculateP2SH(this,prefix);
  local_58.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_address.cpp"
               ,0x2f);
  local_58.filename = local_58.filename + 1;
  local_58.line = 0x17f;
  local_58.funcname = "Address";
  local_5c = kP2shAddress;
  local_5d = AddressFormatData::GetP2shPrefix(local_28);
  logger::info<cfd::core::NetType&,cfd::core::AddressType,unsigned_char>
            (&local_58,"call Address({},{},{})",&this->type_,&local_5c,&local_5d);
  return;
}

Assistant:

Address::Address(
    NetType type, const Script& script,
    const AddressFormatData& network_parameter)
    : type_(type),
      addr_type_(AddressType::kP2shAddress),
      witness_ver_(kVersionNone),
      address_(""),
      hash_(),
      pubkey_(),
      schnorr_pubkey_(),
      redeem_script_(script),
      format_data_(network_parameter) {
  memset(checksum_, 0, sizeof(checksum_));
  SetNetType(format_data_);
  CalculateP2SH(network_parameter.GetP2shPrefix());
  info(
      CFD_LOG_SOURCE, "call Address({},{},{})", type_,
      AddressType::kP2shAddress, network_parameter.GetP2shPrefix());
}